

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-escape.c
# Opt level: O2

_Bool borg_surrounded(void)

{
  int iVar1;
  ushort uVar2;
  chunk_conflict *c;
  monster_race *pmVar3;
  borg_kill *pbVar4;
  _Bool _Var5;
  uint uVar6;
  uint uVar7;
  loc grid;
  char *what;
  int iVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  borg_grid *ag;
  long lVar12;
  
  iVar1 = 0;
  lVar11 = 0x1e8;
  iVar8 = 0;
  for (lVar12 = 1; pbVar4 = borg_kills, pmVar3 = r_info, lVar12 < borg_kills_nxt;
      lVar12 = lVar12 + 1) {
    uVar2 = *(ushort *)(borg_kills->spell + lVar11 + -0x29);
    if (((ulong)uVar2 != 0) && ((int)(uint)uVar2 < (int)(z_info->r_max - 1))) {
      uVar6 = *(wchar_t *)(borg_kills->spell + lVar11 + -0x1d) - borg.c.x;
      uVar9 = -uVar6;
      if (0 < (int)uVar6) {
        uVar9 = uVar6;
      }
      uVar7 = *(wchar_t *)(borg_kills->spell + lVar11 + -0x19) - borg.c.y;
      uVar6 = -uVar7;
      if (0 < (int)uVar7) {
        uVar6 = uVar7;
      }
      if (uVar6 < uVar9) {
        uVar6 = uVar9;
      }
      if (((uVar6 < 4) &&
          (_Var5 = borg_los(borg.c.y,borg.c.x,*(wchar_t *)(borg_kills->spell + lVar11 + -0x19),
                            *(wchar_t *)(borg_kills->spell + lVar11 + -0x1d)), _Var5)) &&
         (pbVar4->spell[lVar11 + -0x26] == '\x01')) {
        _Var5 = flag_has_dbg(pmVar3[uVar2].flags,0xb,0x2e,"r_ptr->flags","RF_PASS_WALL");
        if ((!_Var5) &&
           (_Var5 = flag_has_dbg(pmVar3[uVar2].flags,0xb,0x2f,"r_ptr->flags","RF_KILL_WALL"), !_Var5
           )) {
          iVar1 = iVar1 + (uint)(uVar6 == 1);
          iVar8 = iVar8 + 1;
        }
      }
    }
    lVar11 = lVar11 + 0x1d8;
  }
  iVar10 = 0;
  for (lVar12 = 0; c = cave, lVar12 != 8; lVar12 = lVar12 + 1) {
    ag = borg_grids[(long)ddy_ddd[lVar12] + (long)borg.c.y] + (long)ddx_ddd[lVar12] + (long)borg.c.x
    ;
    grid = (loc)loc((int)((long)ddx_ddd[lVar12] + (long)borg.c.x),
                    (int)((long)ddy_ddd[lVar12] + (long)borg.c.y));
    _Var5 = square_in_bounds_fully(c,grid);
    if (_Var5) {
      _Var5 = borg_cave_floor_grid(ag);
      uVar9 = 1;
      if (((_Var5) && (ag->feat != 0)) && (ag->kill == '\0')) {
        _Var5 = feat_is_shop((uint)ag->feat);
        uVar9 = (uint)_Var5;
      }
      iVar10 = iVar10 + uVar9;
      if (ag->trap == true) {
        iVar10 = iVar10 + (ag->glyph ^ 1);
      }
    }
  }
  if (((iVar10 != 7) || (iVar1 != 1)) && (8 - iVar10 < iVar8)) {
    what = format("# Possibility of being surrounded (monsters/safegrids)(%d/%d)");
    borg_note(what);
    if (borg.goal.ignoring != true) {
      return true;
    }
  }
  return false;
}

Assistant:

bool borg_surrounded(void)
{
    borg_kill           *kill;
    struct monster_race *r_ptr;

    int safe_grids        = 8;
    int non_safe_grids    = 0;
    int monsters          = 0;
    int adjacent_monsters = 0;

    int x9, y9, ax, ay, d;
    int i;

    /* Evaluate the local monsters */
    for (i = 1; i < borg_kills_nxt; i++) {
        kill  = &borg_kills[i];
        r_ptr = &r_info[kill->r_idx];

        /* Skip dead monsters */
        if (!kill->r_idx)
            continue;

        /* "player ghosts" */
        if (kill->r_idx >= z_info->r_max - 1)
            continue;

        x9 = kill->pos.x;
        y9 = kill->pos.y;

        /* Distance components */
        ax = (x9 > borg.c.x) ? (x9 - borg.c.x) : (borg.c.x - x9);
        ay = (y9 > borg.c.y) ? (y9 - borg.c.y) : (borg.c.y - y9);

        /* Distance */
        d = MAX(ax, ay);

        /* if the monster is too far then skip it. */
        if (d > 3)
            continue;

        /* if he cant see me then forget it.*/
        if (!borg_los(borg.c.y, borg.c.x, y9, x9))
            continue;

        /* if asleep, don't consider this one */
        if (!kill->awake)
            continue;

        /* Monsters with Pass Wall are dangerous, no escape from them */
        if (rf_has(r_ptr->flags, RF_PASS_WALL))
            continue;
        if (rf_has(r_ptr->flags, RF_KILL_WALL))
            continue;

        /* Cant really run away from Breeders very well */
        /* if (rf_has(r_ptr->flags, RF_MULTIPLY)) continue; */

        /* Monsters who never move cant surround */
        /* if (rf_has(r_ptr->flags, RF_NEVER_MOVE)) continue; */

        /* keep track of monsters touching me */
        if (d == 1)
            adjacent_monsters++;

        /* Add them up. */
        monsters++;
    }

    /* Evaluate the Non Safe Grids, (walls, closed doors, traps, monsters) */
    for (i = 0; i < 8; i++) {
        int x = borg.c.x + ddx_ddd[i];
        int y = borg.c.y + ddy_ddd[i];

        /* Access the grid */
        borg_grid *ag = &borg_grids[y][x];

        /* Bound check */
        if (!square_in_bounds_fully(cave, loc(x, y)))
            continue;

        /* Skip walls/doors */
        if (!borg_cave_floor_grid(ag))
            non_safe_grids++;

        /* Skip unknown grids */
        else if (ag->feat == FEAT_NONE)
            non_safe_grids++;

        /* Skip monster grids */
        else if (ag->kill)
            non_safe_grids++;

        /* Mega-Hack -- skip stores XXX XXX XXX */
        else if (feat_is_shop(ag->feat))
            non_safe_grids++;

        /* Mega-Hack -- skip traps XXX XXX XXX */
        if (ag->trap && !ag->glyph)
            non_safe_grids++;
    }

    /* Safe grids are decreased */
    safe_grids = safe_grids - non_safe_grids;

    /* Am I in hallway? If so don't worry about it */
    if (safe_grids == 1 && adjacent_monsters == 1)
        return false;

    /* I am likely to get surrounded */
    if (monsters > safe_grids) {
        borg_note(format(
            "# Possibility of being surrounded (monsters/safegrids)(%d/%d)",
            monsters, safe_grids));

        /* The borg can get trapped by continuing to flee
         * into a dead-end.  So he needs to be able to trump this
         * routine.
         */
        if (borg.goal.ignoring) {
            /* borg_note("# Ignoring the fact that I am surrounded.");
             * return false;
             */
        } else
            return true;
    }

    /* Probably will not be surrounded */
    return false;
}